

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_Varint64Truncation::_Run(_Test_Varint64Truncation *this)

{
  char *pcVar1;
  size_t len;
  ulong uVar2;
  uint64_t result;
  string s;
  uint64_t large_value;
  uint64_t uStack_1f8;
  string local_1f0;
  unsigned_long local_1d0;
  Tester local_1c8;
  
  local_1d0 = 0x8000000000000064;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  PutVarint64(&local_1f0,0x8000000000000064);
  for (uVar2 = 0; uVar2 < local_1f0._M_string_length - 1; uVar2 = uVar2 + 1) {
    test::Tester::Tester
              (&local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0xa7);
    pcVar1 = GetVarint64Ptr(local_1f0._M_dataplus._M_p,local_1f0._M_dataplus._M_p + uVar2,
                            &uStack_1f8);
    test::Tester::Is(&local_1c8,pcVar1 == (char *)0x0,
                     "GetVarint64Ptr(s.data(), s.data() + len, &result) == nullptr");
    test::Tester::~Tester(&local_1c8);
  }
  test::Tester::Tester
            (&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0xaa);
  pcVar1 = GetVarint64Ptr(local_1f0._M_dataplus._M_p,
                          local_1f0._M_dataplus._M_p + local_1f0._M_string_length,&uStack_1f8);
  test::Tester::Is(&local_1c8,pcVar1 != (char *)0x0,
                   "GetVarint64Ptr(s.data(), s.data() + s.size(), &result) != nullptr");
  test::Tester::~Tester(&local_1c8);
  test::Tester::Tester
            (&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0xab);
  test::Tester::IsEq<unsigned_long,unsigned_long>(&local_1c8,&local_1d0,&uStack_1f8);
  test::Tester::~Tester(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

TEST(Coding, Varint64Truncation) {
  uint64_t large_value = (1ull << 63) + 100ull;
  std::string s;
  PutVarint64(&s, large_value);
  uint64_t result;
  for (size_t len = 0; len < s.size() - 1; len++) {
    ASSERT_TRUE(GetVarint64Ptr(s.data(), s.data() + len, &result) == nullptr);
  }
  ASSERT_TRUE(GetVarint64Ptr(s.data(), s.data() + s.size(), &result) !=
              nullptr);
  ASSERT_EQ(large_value, result);
}